

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O3

void __thiscall CFlow::DbgRender(CFlow *this)

{
  float fVar1;
  float fVar2;
  long lVar3;
  IGraphics *pIVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  float fVar12;
  float fVar13;
  CLineItem Array [1024];
  
  Array[0x300].m_X1 = 0.0;
  Array[0x300].m_Y1 = 0.0;
  Array[0x200].m_X1 = 0.0;
  Array[0x200].m_Y1 = 0.0;
  Array[0x100].m_X1 = 0.0;
  Array[0x100].m_Y1 = 0.0;
  Array[0].m_X1 = 0.0;
  Array[0].m_Y1 = 0.0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pCells != (CCell *)0x0) {
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])(pIVar4,0xffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])
              ();
    iVar9 = this->m_Height;
    if (0 < iVar9) {
      iVar5 = this->m_Width;
      iVar8 = 0;
      iVar10 = 0;
      iVar6 = iVar5;
      do {
        if (0 < iVar6) {
          lVar11 = 0;
          do {
            fVar12 = (float)((int)lVar11 * this->m_Spacing);
            fVar13 = (float)(this->m_Spacing * iVar10);
            lVar7 = iVar6 * iVar10 + lVar11;
            fVar1 = this->m_pCells[lVar7].m_Vel.field_0.x;
            fVar2 = this->m_pCells[lVar7].m_Vel.field_1.y;
            iVar9 = iVar8 + 1;
            Array[iVar8].m_X0 = fVar12;
            Array[iVar8].m_Y0 = fVar13;
            Array[iVar8].m_X1 = fVar1 * 0.01 + fVar12;
            Array[iVar8].m_Y1 = fVar2 * 0.01 + fVar13;
            iVar8 = iVar9;
            if (iVar9 == 0x400) {
              pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
              (*(pIVar4->super_IInterface)._vptr_IInterface[0x16])(pIVar4,Array,0x400);
              iVar5 = this->m_Width;
              iVar8 = 0;
            }
            lVar11 = lVar11 + 1;
            iVar6 = iVar5;
          } while ((int)lVar11 < iVar5);
          iVar9 = this->m_Height;
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < iVar9);
      if (iVar8 != 0) {
        pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar4->super_IInterface)._vptr_IInterface[0x16])(pIVar4,Array);
      }
    }
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CFlow::DbgRender()
{
	if(!m_pCells)
		return;

	IGraphics::CLineItem Array[1024];
	int NumItems = 0;
	Graphics()->TextureClear();
	Graphics()->LinesBegin();
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			vec2 Pos(x*m_Spacing, y*m_Spacing);
			vec2 Vel = m_pCells[y*m_Width+x].m_Vel * 0.01f;
			Array[NumItems++] = IGraphics::CLineItem(Pos.x, Pos.y, Pos.x+Vel.x, Pos.y+Vel.y);
			if(NumItems == 1024)
			{
				Graphics()->LinesDraw(Array, 1024);
				NumItems = 0;
			}
		}

	if(NumItems)
		Graphics()->LinesDraw(Array, NumItems);
	Graphics()->LinesEnd();
}